

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O2

void __thiscall SSD1306::FileDescriptor::FileDescriptor(FileDescriptor *this,FileDescriptor *rhs)

{
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type p_Stack_10;
  
  this->fd_ = rhs->fd_;
  std::function<bool_(int)>::function(&this->close_if_,&rhs->close_if_);
  rhs->fd_ = -1;
  local_28._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(rhs->close_if_).super__Function_base._M_functor;
  local_28._8_8_ = *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8);
  *(undefined8 *)&(rhs->close_if_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8) = 0;
  local_18 = (rhs->close_if_).super__Function_base._M_manager;
  p_Stack_10 = (rhs->close_if_)._M_invoker;
  (rhs->close_if_).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:62:21)>
       ::_M_manager;
  (rhs->close_if_)._M_invoker =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:62:21)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

SSD1306::FileDescriptor::FileDescriptor(
    SSD1306::FileDescriptor&& rhs)
:
    fd_{rhs.fd_},
    close_if_{std::move(rhs.close_if_)}
{
    rhs.fd_ = -1;
    rhs.close_if_ = [](int) { return false; };
}